

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

void icu_63::initAvailableMetaZoneIDs(void)

{
  UBool UVar1;
  int length;
  UVector *this;
  UResourceBundle *resB;
  char *__s;
  size_t sVar2;
  UChar *us;
  UnicodeString *this_00;
  void *pvVar3;
  code *size;
  UChar *size_00;
  bool bVar4;
  UnicodeString *local_158;
  UVector *local_140;
  UnicodeString *usMzID;
  UChar *uMzID;
  int32_t len;
  char *mzID;
  UResourceBundle res;
  UResourceBundle *bundle;
  UResourceBundle *rb;
  UErrorCode local_c [2];
  UErrorCode status;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_ZONEMETA,zoneMeta_cleanup);
  local_c[0] = U_ZERO_ERROR;
  gMetaZoneIDTable =
       uhash_open_63(uhash_hashUnicodeString_63,uhash_compareUnicodeString_63,(undefined1 *)0x0,
                     local_c);
  UVar1 = ::U_FAILURE(local_c[0]);
  if ((UVar1 == '\0') && (gMetaZoneIDTable != (UHashtable *)0x0)) {
    size = uprv_deleteUObject_63;
    uhash_setKeyDeleter_63(gMetaZoneIDTable,uprv_deleteUObject_63);
    this = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
    local_140 = (UVector *)0x0;
    if (this != (UVector *)0x0) {
      UVector::UVector(this,(UObjectDeleter *)0x0,uhash_compareUChars_63,local_c);
      local_140 = this;
    }
    gMetaZoneIDs = local_140;
    UVar1 = ::U_FAILURE(local_c[0]);
    if ((UVar1 == '\0') && (gMetaZoneIDs != (UVector *)0x0)) {
      UVector::setDeleter(gMetaZoneIDs,uprv_free_63);
      resB = ures_openDirect_63((char *)0x0,"metaZones",local_c);
      res._192_8_ = ures_getByKey_63(resB,"mapTimezones",(UResourceBundle *)0x0,local_c);
      ures_initStackObject_63((UResourceBundle *)&mzID);
      while( true ) {
        UVar1 = ::U_SUCCESS(local_c[0]);
        bVar4 = false;
        if (UVar1 != '\0') {
          UVar1 = ures_hasNext_63((UResourceBundle *)res._192_8_);
          bVar4 = UVar1 != '\0';
        }
        if (!bVar4) goto LAB_0025a1b3;
        ures_getNextResource_63((UResourceBundle *)res._192_8_,(UResourceBundle *)&mzID,local_c);
        UVar1 = ::U_FAILURE(local_c[0]);
        if (UVar1 != '\0') goto LAB_0025a1b3;
        __s = ures_getKey_63((UResourceBundle *)&mzID);
        sVar2 = strlen(__s);
        length = (int)sVar2;
        us = (UChar *)uprv_malloc_63((long)(length + 1) << 1);
        if (us == (UChar *)0x0) break;
        size_00 = us;
        u_charsToUChars_63(__s,us,length);
        us[length] = L'\0';
        this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size_00);
        local_158 = (UnicodeString *)0x0;
        if (this_00 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString(this_00,us);
          local_158 = this_00;
        }
        pvVar3 = uhash_get_63(gMetaZoneIDTable,local_158);
        if (pvVar3 == (void *)0x0) {
          UVector::addElement(gMetaZoneIDs,us,local_c);
          uhash_put_63(gMetaZoneIDTable,local_158,us,local_c);
        }
        else {
          uprv_free_63(us);
          if (local_158 != (UnicodeString *)0x0) {
            (*(local_158->super_Replaceable).super_UObject._vptr_UObject[1])();
          }
        }
      }
      local_c[0] = U_MEMORY_ALLOCATION_ERROR;
LAB_0025a1b3:
      ures_close_63((UResourceBundle *)&mzID);
      ures_close_63((UResourceBundle *)res._192_8_);
      ures_close_63(resB);
      UVar1 = ::U_FAILURE(local_c[0]);
      if (UVar1 != '\0') {
        uhash_close_63(gMetaZoneIDTable);
        if (gMetaZoneIDs != (UVector *)0x0) {
          (*(gMetaZoneIDs->super_UObject)._vptr_UObject[1])();
        }
        gMetaZoneIDTable = (UHashtable *)0x0;
        gMetaZoneIDs = (UVector *)0x0;
      }
    }
    else {
      gMetaZoneIDs = (UVector *)0x0;
      uhash_close_63(gMetaZoneIDTable);
      gMetaZoneIDTable = (UHashtable *)0x0;
    }
  }
  else {
    gMetaZoneIDTable = (UHashtable *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV initAvailableMetaZoneIDs () {
    U_ASSERT(gMetaZoneIDs == NULL);
    U_ASSERT(gMetaZoneIDTable == NULL);
    ucln_i18n_registerCleanup(UCLN_I18N_ZONEMETA, zoneMeta_cleanup);

    UErrorCode status = U_ZERO_ERROR;
    gMetaZoneIDTable = uhash_open(uhash_hashUnicodeString, uhash_compareUnicodeString, NULL, &status);
    if (U_FAILURE(status) || gMetaZoneIDTable == NULL) {
        gMetaZoneIDTable = NULL;
        return;
    }
    uhash_setKeyDeleter(gMetaZoneIDTable, uprv_deleteUObject);
    // No valueDeleter, because the vector maintain the value objects
    gMetaZoneIDs = new UVector(NULL, uhash_compareUChars, status);
    if (U_FAILURE(status) || gMetaZoneIDs == NULL) {
        gMetaZoneIDs = NULL;
        uhash_close(gMetaZoneIDTable);
        gMetaZoneIDTable = NULL;
        return;
    }
    gMetaZoneIDs->setDeleter(uprv_free);

    UResourceBundle *rb = ures_openDirect(NULL, gMetaZones, &status);
    UResourceBundle *bundle = ures_getByKey(rb, gMapTimezonesTag, NULL, &status);
    UResourceBundle res;
    ures_initStackObject(&res);
    while (U_SUCCESS(status) && ures_hasNext(bundle)) {
        ures_getNextResource(bundle, &res, &status);
        if (U_FAILURE(status)) {
            break;
        }
        const char *mzID = ures_getKey(&res);
        int32_t len = static_cast<int32_t>(uprv_strlen(mzID));
        UChar *uMzID = (UChar*)uprv_malloc(sizeof(UChar) * (len + 1));
        if (uMzID == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            break;
        }
        u_charsToUChars(mzID, uMzID, len);
        uMzID[len] = 0;
        UnicodeString *usMzID = new UnicodeString(uMzID);
        if (uhash_get(gMetaZoneIDTable, usMzID) == NULL) {
            gMetaZoneIDs->addElement((void *)uMzID, status);
            uhash_put(gMetaZoneIDTable, (void *)usMzID, (void *)uMzID, &status);
        } else {
            uprv_free(uMzID);
            delete usMzID;
        }
    }
    ures_close(&res);
    ures_close(bundle);
    ures_close(rb);

    if (U_FAILURE(status)) {
        uhash_close(gMetaZoneIDTable);
        delete gMetaZoneIDs;
        gMetaZoneIDTable = NULL;
        gMetaZoneIDs = NULL;
    }
}